

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib519.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  CURL *curl;
  CURLcode res;
  char *URL_local;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
      if ((((curl._4_4_ == 0) &&
           (curl._4_4_ = curl_easy_setopt(lVar2,0x2715,"monster:underbed"), curl._4_4_ == 0)) &&
          (curl._4_4_ = curl_easy_setopt(lVar2,0x2a,1), curl._4_4_ == 0)) &&
         (curl._4_4_ = curl_easy_setopt(lVar2,0x29,1), curl._4_4_ == 0)) {
        curl_easy_perform(lVar2);
        curl._4_4_ = curl_easy_setopt(lVar2,0x2715,"anothermonster:inwardrobe");
        if (curl._4_4_ == 0) {
          curl._4_4_ = curl_easy_perform(lVar2);
        }
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_4_ = curl._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_USERPWD, "monster:underbed");
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* get first page */
  res = curl_easy_perform(curl);

  test_setopt(curl, CURLOPT_USERPWD, "anothermonster:inwardrobe");

  /* get second page */
  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}